

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void GetShellEscapedString(string *input,string *result)

{
  byte bVar1;
  pointer pcVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  const_iterator it;
  char *pcVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  char kEscapeSequence [4];
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util.cc",
                  0x115,"void GetShellEscapedString(const string &, string *)");
  }
  pcVar2 = (input->_M_dataplus)._M_p;
  uVar3 = input->_M_string_length;
  if (uVar3 != 0) {
    bVar8 = true;
    uVar5 = 1;
    do {
      bVar1 = pcVar2[uVar5 - 1];
      if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
         ((0x34 < bVar1 - 0x2b || ((0x1000000000001dU >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0)))
         ) break;
      bVar8 = uVar5 < uVar3;
      bVar9 = uVar5 != uVar3;
      uVar5 = uVar5 + 1;
    } while (bVar9);
    if (bVar8) {
      std::__cxx11::string::push_back((char)result);
      pcVar6 = (input->_M_dataplus)._M_p;
      pcVar4 = pcVar6;
      for (sVar7 = input->_M_string_length; sVar7 != 0; sVar7 = sVar7 - 1) {
        if (*pcVar6 == '\'') {
          std::__cxx11::string::replace
                    ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar4);
          std::__cxx11::string::append((char *)result);
          pcVar4 = pcVar6;
        }
        pcVar6 = pcVar6 + 1;
      }
      std::__cxx11::string::replace
                ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar4);
      std::__cxx11::string::push_back((char)result);
      return;
    }
  }
  std::__cxx11::string::_M_append((char *)result,(ulong)pcVar2);
  return;
}

Assistant:

void GetShellEscapedString(const string& input, string* result) {
  assert(result);

  if (!StringNeedsShellEscaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '\'';
  const char kEscapeSequence[] = "'\\'";

  result->push_back(kQuote);

  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    if (*it == kQuote) {
      result->append(span_begin, it);
      result->append(kEscapeSequence);
      span_begin = it;
    }
  }
  result->append(span_begin, input.end());
  result->push_back(kQuote);
}